

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_user_cmd.cxx
# Opt level: O0

ptr<cmd_result<ptr<buffer>_>_> __thiscall
nuraft::raft_server::append_entries_ext
          (raft_server *this,
          vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
          *logs,req_ext_params *ext_params)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  element_type *peVar4;
  element_type *this_00;
  vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
  *this_01;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_> *in_RDX
  ;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  unsigned_long *in_RSI;
  element_type *in_RDI;
  ptr<cmd_result<ptr<buffer>_>_> pVar6;
  ptr<log_entry> log;
  ptr<buffer> buf;
  const_iterator it;
  ptr<req_msg> req;
  ptr<buffer> result;
  req_ext_params *in_stack_00000448;
  ptr<req_msg> *in_stack_00000450;
  raft_server *in_stack_00000458;
  shared_ptr<nuraft::buffer> *in_stack_fffffffffffffed8;
  vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
  *this_02;
  shared_ptr<nuraft::buffer> *in_stack_fffffffffffffee0;
  shared_ptr<nuraft::buffer> *this_03;
  value_type *in_stack_fffffffffffffee8;
  int *in_stack_fffffffffffffef0;
  int *in_stack_fffffffffffffef8;
  undefined1 *p;
  buffer *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined1 local_c0 [16];
  shared_ptr<nuraft::buffer> *local_b0;
  __normal_iterator<const_std::shared_ptr<nuraft::buffer>_*,_std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>_>
  local_a8;
  undefined1 local_a0 [16];
  undefined8 local_90;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined8 local_78;
  string local_60 [96];
  
  sVar3 = std::
          vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
          ::size(in_RDX);
  if (sVar3 == 0) {
    std::shared_ptr<nuraft::buffer>::shared_ptr(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8)
    ;
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 99));
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x49cb44);
      iVar2 = (**(code **)(*(long *)peVar4 + 0x38))();
      if (3 < iVar2) {
        peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x49cb74);
        msg_if_given_abi_cxx11_((char *)local_60,"return null as log size is zero\n");
        (**(code **)(*(long *)peVar4 + 0x40))
                  (peVar4,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                   ,"append_entries_ext",0x5d,local_60);
        std::__cxx11::string::~string(local_60);
      }
    }
    cs_new<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>,std::shared_ptr<nuraft::buffer>&>
              (in_stack_fffffffffffffed8);
    std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x49cc2b);
    _Var5._M_pi = extraout_RDX;
  }
  else {
    local_78 = 0;
    local_7c = 5;
    local_80 = 0;
    local_84 = 0;
    local_90 = 0;
    local_a0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a0._0_8_ = (element_type *)0x0;
    this_02 = (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
               *)(local_a0 + 8);
    this_03 = (shared_ptr<nuraft::buffer> *)local_a0;
    cs_new<nuraft::req_msg,unsigned_long,nuraft::msg_type,int,int,unsigned_long,unsigned_long,unsigned_long>
              ((unsigned_long *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               (msg_type *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
               in_stack_fffffffffffffef0,(unsigned_long *)in_stack_fffffffffffffee8,in_RSI,
               (unsigned_long *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    local_a8._M_current =
         (shared_ptr<nuraft::buffer> *)
         std::
         vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
         ::begin(this_02);
    while( true ) {
      local_b0 = (shared_ptr<nuraft::buffer> *)
                 std::
                 vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                 ::end(this_02);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::shared_ptr<nuraft::buffer>_*,_std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>_>
                          *)this_03,
                         (__normal_iterator<const_std::shared_ptr<nuraft::buffer>_*,_std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>_>
                          *)this_02);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<nuraft::buffer>_*,_std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>_>
      ::operator*(&local_a8);
      p = local_c0;
      std::shared_ptr<nuraft::buffer>::shared_ptr(this_03,(shared_ptr<nuraft::buffer> *)this_02);
      std::__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x49cd4c);
      nuraft::buffer::pos(in_stack_ffffffffffffff00,(size_t)p);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<nuraft::buffer>_*,_std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>_>
      ::operator*(&local_a8);
      cs_new<nuraft::log_entry,int,std::shared_ptr<nuraft::buffer>const&,nuraft::log_val_type>
                ((int *)in_stack_fffffffffffffee8,this_03,(log_val_type *)this_02);
      this_00 = std::__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x49cd9a);
      this_01 = req_msg::log_entries(this_00);
      std::
      vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
      ::push_back(this_01,in_stack_fffffffffffffee8);
      std::shared_ptr<nuraft::log_entry>::~shared_ptr((shared_ptr<nuraft::log_entry> *)0x49cdc4);
      std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x49cdce);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<nuraft::buffer>_*,_std::vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>_>
      ::operator++(&local_a8);
    }
    send_msg_to_leader(in_stack_00000458,in_stack_00000450,in_stack_00000448);
    std::shared_ptr<nuraft::req_msg>::~shared_ptr((shared_ptr<nuraft::req_msg> *)0x49ce4e);
    _Var5._M_pi = extraout_RDX_00;
  }
  pVar6.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var5._M_pi;
  pVar6.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (ptr<cmd_result<ptr<buffer>_>_>)
         pVar6.
         super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr< cmd_result< ptr<buffer> > > raft_server::append_entries_ext
                                 ( const std::vector< ptr<buffer> >& logs,
                                   const req_ext_params& ext_params )
{
    if (logs.size() == 0) {
        ptr<buffer> result(nullptr);
        p_in("return null as log size is zero\n");
        return cs_new< cmd_result< ptr<buffer> > >(result);
    }

    ptr<req_msg> req = cs_new<req_msg>
                       ( (ulong)0, msg_type::client_request, 0, 0,
                         (ulong)0, (ulong)0, (ulong)0 ) ;
    for (auto it = logs.begin(); it != logs.end(); ++it) {
        ptr<buffer> buf = *it;
        // Just in case when user forgot to reset the position.
        buf->pos(0);
        ptr<log_entry> log( cs_new<log_entry>
                            ( 0, *it, log_val_type::app_log ) );
        req->log_entries().push_back(log);
    }

    return send_msg_to_leader(req, ext_params);
}